

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O1

aom_codec_err_t av1_firstpass_info_pop(FIRSTPASS_INFO *firstpass_info)

{
  aom_codec_err_t aVar1;
  
  aVar1 = AOM_CODEC_ERROR;
  if ((0 < firstpass_info->stats_count) && (0 < firstpass_info->past_stats_count)) {
    firstpass_info->start_index = (firstpass_info->start_index + 1) % firstpass_info->stats_buf_size
    ;
    firstpass_info->stats_count = firstpass_info->stats_count + -1;
    firstpass_info->past_stats_count = firstpass_info->past_stats_count + -1;
    aVar1 = AOM_CODEC_OK;
  }
  return aVar1;
}

Assistant:

aom_codec_err_t av1_firstpass_info_pop(FIRSTPASS_INFO *firstpass_info) {
  if (firstpass_info->stats_count > 0 && firstpass_info->past_stats_count > 0) {
    const int next_start =
        (firstpass_info->start_index + 1) % firstpass_info->stats_buf_size;
    firstpass_info->start_index = next_start;
    --firstpass_info->stats_count;
    --firstpass_info->past_stats_count;
    return AOM_CODEC_OK;
  } else {
    return AOM_CODEC_ERROR;
  }
}